

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

void __thiscall
TasGrid::GridLocalPolynomial::applyTransformationTransposed<1>
          (GridLocalPolynomial *this,double *weights,MultiIndexSet *work,
          vector<int,_std::allocator<int>_> *active_points)

{
  switch(this->effective_rule) {
  case pwc:
    applyTransformationTransposed<1,(TasGrid::RuleLocal::erule)0>(this,weights,work,active_points);
    return;
  case localp:
    applyTransformationTransposed<1,(TasGrid::RuleLocal::erule)1>(this,weights,work,active_points);
    return;
  case semilocalp:
    applyTransformationTransposed<1,(TasGrid::RuleLocal::erule)2>(this,weights,work,active_points);
    return;
  case localp0:
    applyTransformationTransposed<1,(TasGrid::RuleLocal::erule)3>(this,weights,work,active_points);
    return;
  default:
    applyTransformationTransposed<1,(TasGrid::RuleLocal::erule)4>(this,weights,work,active_points);
    return;
  }
}

Assistant:

void GridLocalPolynomial::applyTransformationTransposed(double weights[], const MultiIndexSet &work, const std::vector<int> &active_points) const {
    switch(effective_rule) {
        case RuleLocal::erule::pwc:
            applyTransformationTransposed<mode, RuleLocal::erule::pwc>(weights, work, active_points);
            break;
        case RuleLocal::erule::localp:
            applyTransformationTransposed<mode, RuleLocal::erule::localp>(weights, work, active_points);
            break;
        case RuleLocal::erule::semilocalp:
            applyTransformationTransposed<mode, RuleLocal::erule::semilocalp>(weights, work, active_points);
            break;
        case RuleLocal::erule::localp0:
            applyTransformationTransposed<mode, RuleLocal::erule::localp0>(weights, work, active_points);
            break;
        default: // case RuleLocal::erule::localpb:
            applyTransformationTransposed<mode, RuleLocal::erule::localpb>(weights, work, active_points);
            break;
    };
}